

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QConfFileSettingsPrivate::ensureSectionParsed
          (QConfFileSettingsPrivate *this,QConfFile *confFile,QSettingsKey *key)

{
  UnparsedSettingsMap *this_00;
  QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
  *pQVar1;
  bool bVar2;
  qsizetype qVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  ParsedSettingsMap *in_R8;
  QByteArrayView data;
  
  pQVar1 = (confFile->unparsedIniSections).d.d.ptr;
  if ((pQVar1 != (QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    this_00 = &confFile->unparsedIniSections;
    qVar3 = QString::indexOf(&key->super_QString,(QChar)0x2f,0,CaseSensitive);
    if (qVar3 == -1) {
      iVar5._M_node = (_Base_ptr)QMap<QSettingsKey,_QByteArray>::begin(this_00);
      iVar6._M_node = (_Base_ptr)QMap<QSettingsKey,_QByteArray>::end(this_00);
      if ((iVar5._M_node != iVar6._M_node) && (*(long *)((long)iVar5._M_node + 0x30) == 0))
      goto LAB_003d830a;
    }
    else {
      iVar4 = QMap<QSettingsKey,_QByteArray>::upperBound(this_00,key);
      iVar5._M_node = (_Base_ptr)QMap<QSettingsKey,_QByteArray>::begin(this_00);
      if ((iVar4.i._M_node != (iterator)iVar5._M_node) &&
         ((iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar4.i._M_node),
          iVar5._M_node[1]._M_left != (_Base_ptr)0x0 &&
          (bVar2 = QString::startsWith(&key->super_QString,(QString *)(iVar5._M_node + 1),
                                       CaseSensitive), bVar2)))) {
LAB_003d830a:
        data.m_data = (storage_type *)&confFile->originalKeys;
        data.m_size = *(qsizetype *)(iVar5._M_node + 2);
        bVar2 = readIniSection((QConfFileSettingsPrivate *)(iVar5._M_node + 1),
                               (QSettingsKey *)iVar5._M_node[2]._M_parent,data,in_R8);
        if ((!bVar2) && ((this->super_QSettingsPrivate).status == NoError)) {
          (this->super_QSettingsPrivate).status = FormatError;
        }
        QMap<QSettingsKey,_QByteArray>::erase(this_00,(const_iterator)iVar5._M_node);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }